

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  int *piVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  string *unaff_retaddr;
  int i;
  string tempDir;
  Rand48 rand48;
  string *in_stack_000000c0;
  unsigned_long in_stack_ffffffffffffff68;
  Rand48 *in_stack_ffffffffffffff70;
  int local_48;
  string local_38 [40];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  time((time_t *)0x0);
  Imath_2_5::Rand48::Rand48(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::string(local_38);
  while( true ) {
    std::__cxx11::string::operator=(local_38,"/var/tmp/IlmImfTest_");
    for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
      lVar2 = Imath_2_5::Rand48::nexti((Rand48 *)0x10ff59);
      std::__cxx11::string::operator+=
                (local_38,(char)lVar2 +
                          ((char)(SUB168(SEXT816(lVar2) * SEXT816(0x4ec4ec4ec4ec4ec5),8) >> 3) -
                          (SUB161(SEXT816(lVar2) * SEXT816(0x4ec4ec4ec4ec4ec5),0xf) >> 7)) * -0x1a +
                          'A');
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = mkdir(pcVar3,0x1ff);
    if (iVar1 == 0) break;
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Cannot create directory ");
      poVar5 = std::operator<<(poVar5,local_38);
      poVar5 = std::operator<<(poVar5,". ");
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      poVar5 = std::operator<<(poVar5,pcVar3);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
LAB_001101f2:
      std::__cxx11::string::~string(local_38);
      return local_4;
    }
  }
  std::__cxx11::string::operator+=(local_38,"/");
  poVar5 = std::operator<<((ostream *)&std::cout,"using temporary directory ");
  poVar5 = std::operator<<(poVar5,local_38);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if ((local_8 < 2) || (iVar1 = strcmp(*(char **)(local_10 + 8),"testFlatImage"), iVar1 == 0)) {
    testFlatImage(unaff_retaddr);
  }
  if ((local_8 < 2) || (iVar1 = strcmp(*(char **)(local_10 + 8),"testDeepImage"), iVar1 == 0)) {
    testDeepImage(unaff_retaddr);
  }
  if ((local_8 < 2) || (iVar1 = strcmp(*(char **)(local_10 + 8),"testIO"), iVar1 == 0)) {
    testIO(in_stack_000000c0);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"removing temporary directory ");
  poVar5 = std::operator<<(poVar5,local_38);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  rmdir(pcVar3);
  local_4 = 0;
  goto LAB_001101f2;
}

Assistant:

int
main (int argc, char *argv[])
{
    //
    // Create temporary files in a uniquely named private temporary
    // subdirectory of IMF_TMP_DIR to avoid colliding with other running
    // instances of this program.
    //

    IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*)0) );
    std::string tempDir;

    while (true)
    {
#ifdef _WIN32
        char tmpbuf[4096];
        DWORD len = GetTempPathA(4096, tmpbuf);
        if ( len == 0 || len > 4095 )
        {
            cerr << "Cannot retrieve temporary directory" << endl;
            return 1;
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "IlmImfTest_";
#else
        tempDir = IMF_TMP_DIR "IlmImfTest_";
#endif
        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti() % 26);

        if (mkdir (tempDir.c_str(), 0777) == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;
            break; // success
        }

        if (errno != EEXIST)
        {
            cerr << "Cannot create directory " << tempDir << ". " <<
                    strerror (errno) << endl;

            return 1;
        }
    }

    cout << "using temporary directory " << tempDir << endl;

    TEST (testFlatImage);
    TEST (testDeepImage);
    TEST (testIO);

    cout << "removing temporary directory " << tempDir << endl;
    rmdir (tempDir.c_str());

    return 0;
}